

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O3

bool __thiscall
cmSubdirCommand::InitialPass
          (cmSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  char *pcVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  ulong *puVar9;
  ulong uVar10;
  undefined8 uVar11;
  bool excludeFromAll;
  pointer inName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string binPath;
  string srcPath;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  undefined4 local_98;
  allocator local_91;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  inName = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == inName) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_98 = 0;
  }
  else {
    paVar1 = &local_b8.field_2;
    local_98 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    excludeFromAll = false;
    do {
      iVar4 = std::__cxx11::string::compare((char *)inName);
      if (iVar4 == 0) {
        excludeFromAll = true;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)inName);
        if (iVar4 != 0) {
          pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&local_d8,pcVar5,(allocator *)local_70);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_b8.field_2._M_allocated_capacity = *psVar8;
            local_b8.field_2._8_8_ = plVar6[3];
            local_b8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar8;
            local_b8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_b8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_90.field_2._M_allocated_capacity = *psVar8;
            local_90.field_2._8_8_ = plVar6[3];
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar8;
            local_90._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_90._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          bVar3 = cmsys::SystemTools::FileIsDirectory(&local_90);
          if (bVar3) {
            pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
            std::__cxx11::string::string((string *)local_70,pcVar5,(allocator *)&local_50);
            plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
            local_d8 = &local_c8;
            puVar9 = (ulong *)(plVar6 + 2);
            if ((ulong *)*plVar6 == puVar9) {
              local_c8 = *puVar9;
              lStack_c0 = plVar6[3];
            }
            else {
              local_c8 = *puVar9;
              local_d8 = (ulong *)*plVar6;
            }
            local_d0 = plVar6[1];
            *plVar6 = (long)puVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
            psVar8 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_b8.field_2._M_allocated_capacity = *psVar8;
              local_b8.field_2._8_8_ = puVar7[3];
              local_b8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar8;
              local_b8._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_b8._M_string_length = puVar7[1];
            *puVar7 = psVar8;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            cmMakefile::AddSubDirectory
                      ((this->super_cmCommand).Makefile,&local_90,&local_b8,excludeFromAll,false);
LAB_003ea0f0:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar3 = cmsys::SystemTools::FileIsDirectory(inName);
            if (bVar3) {
              pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
              std::__cxx11::string::string((string *)local_70,pcVar5,&local_91);
              plVar6 = (long *)std::__cxx11::string::append((char *)local_70);
              local_d8 = &local_c8;
              puVar9 = (ulong *)(plVar6 + 2);
              if ((ulong *)*plVar6 == puVar9) {
                local_c8 = *puVar9;
                lStack_c0 = plVar6[3];
              }
              else {
                local_c8 = *puVar9;
                local_d8 = (ulong *)*plVar6;
              }
              local_d0 = plVar6[1];
              *plVar6 = (long)puVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              cmsys::SystemTools::GetFilenameName(&local_50,inName);
              uVar10 = 0xf;
              if (local_d8 != &local_c8) {
                uVar10 = local_c8;
              }
              if (uVar10 < local_50._M_string_length + local_d0) {
                uVar11 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  uVar11 = local_50.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar11 < local_50._M_string_length + local_d0) goto LAB_003ea019;
                puVar7 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_50,0,(char *)0x0,(ulong)local_d8);
              }
              else {
LAB_003ea019:
                puVar7 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_50._M_dataplus._M_p);
              }
              psVar8 = puVar7 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar8) {
                local_b8.field_2._M_allocated_capacity = *psVar8;
                local_b8.field_2._8_8_ = puVar7[3];
                local_b8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_b8.field_2._M_allocated_capacity = *psVar8;
                local_b8._M_dataplus._M_p = (pointer)*puVar7;
              }
              local_b8._M_string_length = puVar7[1];
              *puVar7 = psVar8;
              puVar7[1] = 0;
              *(undefined1 *)psVar8 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,local_c8 + 1);
              }
              if (local_70[0] != local_60) {
                operator_delete(local_70[0],local_60[0] + 1);
              }
              cmMakefile::AddSubDirectory
                        ((this->super_cmCommand).Makefile,inName,&local_b8,excludeFromAll,false);
              goto LAB_003ea0f0;
            }
            local_b8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"Incorrect SUBDIRS command. Directory: ","");
            local_d8 = &local_c8;
            pcVar2 = (inName->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pcVar2,pcVar2 + inName->_M_string_length);
            std::__cxx11::string::append((char *)&local_d8);
            std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
            }
            cmCommand::SetError(&this->super_cmCommand,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            local_98 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
      inName = inName + 1;
    } while (inName != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return (bool)((byte)local_98 & 1);
}

Assistant:

bool cmSubdirCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  bool res = true;
  bool excludeFromAll = false;

  for(std::vector<std::string>::const_iterator i = args.begin();
      i != args.end(); ++i)
    {
    if(*i == "EXCLUDE_FROM_ALL")
      {
      excludeFromAll = true;
      continue;
      }
    if(*i == "PREORDER")
      {
      // Ignored
      continue;
      }

    // if they specified a relative path then compute the full
    std::string srcPath =
      std::string(this->Makefile->GetCurrentSourceDirectory()) +
        "/" + i->c_str();
    if (cmSystemTools::FileIsDirectory(srcPath))
      {
      std::string binPath =
        std::string(this->Makefile->GetCurrentBinaryDirectory()) +
        "/" + i->c_str();
      this->Makefile->AddSubDirectory(srcPath, binPath,
                                  excludeFromAll, false);
      }
    // otherwise it is a full path
    else if ( cmSystemTools::FileIsDirectory(*i) )
      {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath =
        std::string(this->Makefile->GetCurrentBinaryDirectory()) +
        "/" + cmSystemTools::GetFilenameName(*i);
      this->Makefile->AddSubDirectory(*i, binPath,
                                  excludeFromAll, false);
      }
    else
      {
      std::string error = "Incorrect SUBDIRS command. Directory: ";
      error += *i + " does not exist.";
      this->SetError(error);
      res = false;
      }
    }
  return res;
}